

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O0

Endpoint * __thiscall
helics::MessageFederate::registerEndpoint
          (MessageFederate *this,string_view eptName,string_view type,bool global,bool targeted)

{
  string_view type_00;
  string_view type_01;
  string_view eptName_00;
  string_view eptName_01;
  string_view type_02;
  string_view type_03;
  string_view eptName_02;
  string_view eptName_03;
  MessageFederate *in_RDX;
  MessageFederate *in_RDI;
  byte in_R9B;
  byte in_stack_00000008;
  size_t in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  MessageFederate *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined8 local_8;
  
  if ((in_stack_00000008 & 1) == 0) {
    if ((in_R9B & 1) == 0) {
      eptName_03._M_str = in_stack_ffffffffffffffc0;
      eptName_03._M_len = in_stack_ffffffffffffffb8;
      type_03._M_str = in_stack_ffffffffffffffb0;
      type_03._M_len = in_stack_ffffffffffffffa8;
      local_8 = registerEndpoint(in_stack_ffffffffffffffa0,eptName_03,type_03);
    }
    else {
      eptName_01._M_str = in_stack_ffffffffffffff60;
      eptName_01._M_len = in_stack_ffffffffffffff58;
      type_01._M_str = in_stack_ffffffffffffff50;
      type_01._M_len = in_stack_ffffffffffffff48;
      local_8 = registerGlobalEndpoint(in_RDI,eptName_01,type_01);
    }
  }
  else if ((in_R9B & 1) == 0) {
    eptName_02._M_str = in_stack_ffffffffffffffc0;
    eptName_02._M_len = in_stack_ffffffffffffffb8;
    type_02._M_str = in_stack_ffffffffffffffb0;
    type_02._M_len = in_stack_ffffffffffffffa8;
    local_8 = registerTargetedEndpoint(in_RDX,eptName_02,type_02);
  }
  else {
    eptName_00._M_str = in_stack_ffffffffffffff60;
    eptName_00._M_len = in_stack_ffffffffffffff58;
    type_00._M_str = in_stack_ffffffffffffff50;
    type_00._M_len = in_stack_ffffffffffffff48;
    local_8 = registerGlobalTargetedEndpoint(in_RDI,eptName_00,type_00);
  }
  return local_8;
}

Assistant:

Endpoint& MessageFederate::registerEndpoint(std::string_view eptName,
                                            std::string_view type,
                                            bool global,
                                            bool targeted)
{
    if (targeted) {
        if (global) {
            return registerGlobalTargetedEndpoint(eptName, type);
        }
        return registerTargetedEndpoint(eptName, type);
    }
    if (global) {
        return registerGlobalEndpoint(eptName, type);
    }
    return registerEndpoint(eptName, type);
}